

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testRunEnded(StreamingReporterBase *this,TestRunStats *param_2)

{
  LazyStat<Catch::TestCaseInfo> *in_RSI;
  
  LazyStat<Catch::TestCaseInfo>::reset(in_RSI);
  LazyStat<Catch::GroupInfo>::reset((LazyStat<Catch::GroupInfo> *)in_RSI);
  LazyStat<Catch::TestRunInfo>::reset((LazyStat<Catch::TestRunInfo> *)in_RSI);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& /* _testRunStats */ ) {
            currentTestCaseInfo.reset();
            currentGroupInfo.reset();
            currentTestRunInfo.reset();
        }